

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

gdImagePtr gdImageCopyGaussianBlurred(gdImagePtr src,int radius,double sigma)

{
  bool bVar1;
  int iVar2;
  double *coeffs_00;
  gdImagePtr dst;
  int tcstat;
  int freeSrc;
  double *coeffs;
  gdImagePtr result;
  gdImagePtr tmp;
  double sigma_local;
  gdImagePtr pgStack_18;
  int radius_local;
  gdImagePtr src_local;
  
  bVar1 = false;
  if (radius < 1) {
    src_local = (gdImagePtr)0x0;
  }
  else {
    coeffs_00 = gaussian_coeffs(radius,sigma);
    if (coeffs_00 == (double *)0x0) {
      src_local = (gdImagePtr)0x0;
    }
    else {
      pgStack_18 = src;
      if (src->trueColor == 0) {
        pgStack_18 = gdImageClone(src);
        if (pgStack_18 == (gdImagePtr)0x0) {
          gdFree(coeffs_00);
          return (gdImagePtr)0x0;
        }
        iVar2 = gdImagePaletteToTrueColor(pgStack_18);
        if (iVar2 == 0) {
          gdImageDestroy(pgStack_18);
          gdFree(coeffs_00);
          return (gdImagePtr)0x0;
        }
        bVar1 = true;
      }
      dst = gdImageCreateTrueColor(pgStack_18->sx,pgStack_18->sy);
      if (dst == (gdImagePtr)0x0) {
        gdFree(coeffs_00);
        src_local = (gdImagePtr)0x0;
      }
      else {
        applyCoeffs(pgStack_18,dst,coeffs_00,radius,HORIZONTAL);
        src_local = gdImageCreateTrueColor(pgStack_18->sx,pgStack_18->sy);
        if (src_local != (gdImagePtr)0x0) {
          applyCoeffs(dst,src_local,coeffs_00,radius,VERTICAL);
        }
        gdImageDestroy(dst);
        gdFree(coeffs_00);
        if (bVar1) {
          gdImageDestroy(pgStack_18);
        }
      }
    }
  }
  return src_local;
}

Assistant:

BGD_DECLARE(gdImagePtr)
gdImageCopyGaussianBlurred(gdImagePtr src, int radius, double sigma)
{
    gdImagePtr tmp = NULL, result = NULL;
    double *coeffs;
    int freeSrc = 0;

    if (radius < 1) {
        return NULL;
    }/* if */

    /* Compute the coefficients. */
    coeffs = gaussian_coeffs(radius, sigma);
    if (!coeffs) {
        return NULL;
    }/* if */

    /* If the image is not truecolor, we first make a truecolor
     * scratch copy. */
	if (!src->trueColor) {
        int tcstat;

        src = gdImageClone(src);
        if (!src) {
			gdFree(coeffs);
			return NULL;
		}

        tcstat = gdImagePaletteToTrueColor(src);
        if (!tcstat) {
            gdImageDestroy(src);
			gdFree(coeffs);
            return NULL;
        }/* if */
		
        freeSrc = 1;
	}/* if */

    /* Apply the filter horizontally. */
    tmp = gdImageCreateTrueColor(src->sx, src->sy);
    if (!tmp) {
		gdFree(coeffs);
		return NULL;
	}
    applyCoeffs(src, tmp, coeffs, radius, HORIZONTAL);

    /* Apply the filter vertically. */
    result = gdImageCreateTrueColor(src->sx, src->sy);
    if (result) {
        applyCoeffs(tmp, result, coeffs, radius, VERTICAL);
    }/* if */

    gdImageDestroy(tmp);
    gdFree(coeffs);

    if (freeSrc) gdImageDestroy(src);

    return result;
}